

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem_capi.cpp
# Opt level: O2

void __thiscall rlottie::internal::renderer::SolidLayer::buildLayerNode(SolidLayer *this)

{
  CApiData *pCVar1;
  pointer ppLVar2;
  Drawable *this_00;
  LOTNode *in_RAX;
  long lVar3;
  DrawableList DVar4;
  _Head_base<0UL,_LOTNode_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  Layer::buildLayerNode(&this->super_Layer);
  DVar4 = renderList(this);
  pCVar1 = (this->super_Layer).mCApiData._M_t.
           super___uniq_ptr_impl<rlottie::internal::renderer::CApiData,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::renderer::CApiData_*,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           .super__Head_base<0UL,_rlottie::internal::renderer::CApiData_*,_false>._M_head_impl;
  ppLVar2 = *(pointer *)
             &(pCVar1->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_>._M_impl
  ;
  if (*(pointer *)
       ((long)&(pCVar1->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_> + 8)
      != ppLVar2) {
    *(pointer *)
     ((long)&(pCVar1->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_> + 8) =
         ppLVar2;
  }
  for (lVar3 = 0; DVar4._size << 3 != lVar3; lVar3 = lVar3 + 8) {
    this_00 = *(Drawable **)((long)DVar4._data + lVar3);
    Drawable::sync(this_00);
    local_38._M_head_impl =
         (this_00->mCNode)._M_t.super___uniq_ptr_impl<LOTNode,_std::default_delete<LOTNode>_>._M_t.
         super__Tuple_impl<0UL,_LOTNode_*,_std::default_delete<LOTNode>_>.
         super__Head_base<0UL,_LOTNode_*,_false>._M_head_impl;
    std::vector<LOTNode*,std::allocator<LOTNode*>>::emplace_back<LOTNode*>
              ((vector<LOTNode*,std::allocator<LOTNode*>> *)
               &((this->super_Layer).mCApiData._M_t.
                 super___uniq_ptr_impl<rlottie::internal::renderer::CApiData,_std::default_delete<rlottie::internal::renderer::CApiData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_rlottie::internal::renderer::CApiData_*,_std::default_delete<rlottie::internal::renderer::CApiData>_>
                 .super__Head_base<0UL,_rlottie::internal::renderer::CApiData_*,_false>._M_head_impl
                )->mCNodeList,&local_38._M_head_impl);
  }
  pCVar1 = (this->super_Layer).mCApiData._M_t.
           super___uniq_ptr_impl<rlottie::internal::renderer::CApiData,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::renderer::CApiData_*,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           .super__Head_base<0UL,_rlottie::internal::renderer::CApiData_*,_false>._M_head_impl;
  (pCVar1->mLayer).mNodeList.ptr =
       *(LOTNode ***)
        &(pCVar1->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_>._M_impl;
  pCVar1 = (this->super_Layer).mCApiData._M_t.
           super___uniq_ptr_impl<rlottie::internal::renderer::CApiData,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::renderer::CApiData_*,_std::default_delete<rlottie::internal::renderer::CApiData>_>
           .super__Head_base<0UL,_rlottie::internal::renderer::CApiData_*,_false>._M_head_impl;
  *(long *)((long)&(pCVar1->mLayer).mNodeList + 8) =
       (long)*(pointer *)
              ((long)&(pCVar1->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_>
              + 8) -
       *(long *)&(pCVar1->mCNodeList).super__Vector_base<LOTNode_*,_std::allocator<LOTNode_*>_>.
                 _M_impl >> 3;
  return;
}

Assistant:

void renderer::SolidLayer::buildLayerNode()
{
    renderer::Layer::buildLayerNode();

    auto renderlist = renderList();

    cnodes().clear();
    for (auto &i : renderlist) {
        auto lotDrawable = static_cast<renderer::Drawable *>(i);
        lotDrawable->sync();
        cnodes().push_back(lotDrawable->mCNode.get());
    }
    clayer().mNodeList.ptr = cnodes().data();
    clayer().mNodeList.size = cnodes().size();
}